

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O2

int checkerBig(void)

{
  int iVar1;
  long in_RAX;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  long lStack_38;
  int n;
  
  lStack_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
  }
  else {
    iVar1 = 2000000;
    iVar4 = 0;
    do {
      iVar3 = iVar4;
      iVar4 = iVar1 + -1;
      if (iVar1 == 0) {
        iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
        fclose(__stream);
        if (iVar1 != 0) goto LAB_0010265b;
        puts("PASSED");
        iVar1 = 0;
        goto LAB_0010266a;
      }
      pcVar2 = ScanInt((FILE *)__stream,&n);
      if (pcVar2 != "PASSED") goto LAB_0010263e;
    } while (((-1 < lStack_38) && ((int)(n ^ 0x1234567U) < 2000000)) &&
            ((bVar5 = iVar1 == 2000000, iVar1 = iVar4, iVar4 = n, bVar5 ||
             (iVar4 = iVar3, iVar3 < n))));
    printf("wrong output -- ");
LAB_0010263e:
    fclose(__stream);
LAB_0010265b:
    puts("FAILED");
    iVar1 = 1;
  }
LAB_0010266a:
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int checkerBig(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1, last = 0;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if ((n^0x1234567) < 0 || 2000000 <= (n^0x1234567)) {
            passed = 0;
            printf("wrong output -- ");
            break;
        } else if (i == 0) {
            last = n;
            continue;
        } else if (n <= last ) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}